

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

int run_test_fs_event_watch_invalid_path(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_fs_event_init(puVar2,&fs_event);
  if (iVar1 == 0) {
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"<:;",0);
    if (iVar1 == 0) {
      pcVar4 = "r != 0";
      uVar3 = 0x48e;
    }
    else {
      iVar1 = uv_is_active((uv_handle_t *)&fs_event);
      if (iVar1 == 0) {
        iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"",0);
        if (iVar1 == 0) {
          pcVar4 = "r != 0";
          uVar3 = 0x491;
        }
        else {
          iVar1 = uv_is_active((uv_handle_t *)&fs_event);
          if (iVar1 == 0) {
            puVar2 = uv_default_loop();
            close_loop(puVar2);
            puVar2 = uv_default_loop();
            iVar1 = uv_loop_close(puVar2);
            if (iVar1 == 0) {
              return 0;
            }
            pcVar4 = "0 == uv_loop_close(uv_default_loop())";
            uVar3 = 0x493;
          }
          else {
            pcVar4 = "uv_is_active((uv_handle_t*) &fs_event) == 0";
            uVar3 = 0x492;
          }
        }
      }
      else {
        pcVar4 = "uv_is_active((uv_handle_t*) &fs_event) == 0";
        uVar3 = 0x48f;
      }
    }
  }
  else {
    pcVar4 = "r == 0";
    uVar3 = 0x48c;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(fs_event_watch_invalid_path) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif

  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();
  r = uv_fs_event_init(loop, &fs_event);
  ASSERT(r == 0);
  r = uv_fs_event_start(&fs_event, fs_event_cb_file, "<:;", 0);
  ASSERT(r != 0);
  ASSERT(uv_is_active((uv_handle_t*) &fs_event) == 0);
  r = uv_fs_event_start(&fs_event, fs_event_cb_file, "", 0);
  ASSERT(r != 0);
  ASSERT(uv_is_active((uv_handle_t*) &fs_event) == 0);
  MAKE_VALGRIND_HAPPY();
  return 0;
}